

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::NetStateRule::InternalSerializeWithCachedSizesToArray
          (NetStateRule *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  Phase value;
  int32 iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  string *psVar6;
  UnknownFieldSet *unknown_fields;
  int local_50;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  NetStateRule *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar1 & 1) != 0) {
    value = phase(this);
    _i = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,value,target);
  }
  if ((uVar1 & 2) != 0) {
    iVar2 = min_level(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2,iVar2,_i);
  }
  if ((uVar1 & 4) != 0) {
    iVar2 = max_level(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3,iVar2,_i);
  }
  i_1 = 0;
  iVar3 = stage_size(this);
  for (; i_1 < iVar3; i_1 = i_1 + 1) {
    stage_abi_cxx11_(this,i_1);
    pcVar5 = (char *)std::__cxx11::string::data();
    stage_abi_cxx11_(this,i_1);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar4,SERIALIZE,"caffe.NetStateRule.stage");
    psVar6 = stage_abi_cxx11_(this,i_1);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(4,psVar6,_i);
  }
  local_50 = 0;
  iVar3 = not_stage_size(this);
  for (; local_50 < iVar3; local_50 = local_50 + 1) {
    not_stage_abi_cxx11_(this,local_50);
    pcVar5 = (char *)std::__cxx11::string::data();
    not_stage_abi_cxx11_(this,local_50);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar4,SERIALIZE,"caffe.NetStateRule.not_stage");
    psVar6 = not_stage_abi_cxx11_(this,local_50);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(5,psVar6,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = NetStateRule::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* NetStateRule::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetStateRule)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->phase(), target);
  }

  // optional int32 min_level = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->min_level(), target);
  }

  // optional int32 max_level = 3;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->max_level(), target);
  }

  // repeated string stage = 4;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(4, this->stage(i), target);
  }

  // repeated string not_stage = 5;
  for (int i = 0, n = this->not_stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->not_stage(i).data(), this->not_stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.not_stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(5, this->not_stage(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetStateRule)
  return target;
}